

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  iterator iVar4;
  ostream *poVar5;
  PolicyID id;
  bool system;
  string module;
  string mfile;
  string var;
  bool local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Find","");
  std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_1e8);
  local_209 = false;
  cmMakefile::GetModulesFile
            (&local_1c8,(this->super_cmFindCommon).super_cmCommand.Makefile,&local_1e8,&local_209);
  bVar2 = true;
  if (local_1c8._M_string_length != 0) {
    if (local_209 == true) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::find(&(this->DeprecatedFindModules)._M_t,&this->Name);
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->DeprecatedFindModules)._M_t._M_impl.super__Rb_tree_header) {
        PVar3 = cmMakefile::GetPolicyStatus
                          ((this->super_cmFindCommon).super_cmCommand.Makefile,
                           iVar4._M_node[2]._M_color,false);
        if (PVar3 - NEW < 3) goto LAB_00200c0d;
        if (PVar3 == WARN) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    (&local_208,(cmPolicies *)(ulong)iVar4._M_node[2]._M_color,id);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          this_00 = (this->super_cmFindCommon).super_cmCommand.Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
    }
    *found = true;
    pcVar1 = (this->Name)._M_dataplus._M_p;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar1,pcVar1 + (this->Name)._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cmMakefile::AddDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_1a8,"1");
    bVar2 = ReadListFile(this,&local_1c8,DoPolicyScope);
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
LAB_00200c0d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string module = "Find";
  module += this->Name;
  module += ".cmake";
  bool system = false;
  std::string mfile = this->Makefile->GetModulesFile(module, system);
  if (!mfile.empty()) {
    if (system) {
      auto it = this->DeprecatedFindModules.find(this->Name);
      if (it != this->DeprecatedFindModules.end()) {
        cmPolicies::PolicyStatus status =
          this->Makefile->GetPolicyStatus(it->second);
        switch (status) {
          case cmPolicies::WARN: {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(it->second) << "\n";
            this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            return true;
        }
      }
    }

    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string var = this->Name;
    var += "_FIND_MODULE";
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile, DoPolicyScope);
    this->Makefile->RemoveDefinition(var);
    return result;
  }
  return true;
}